

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O3

tensor * __thiscall ABS::forward(ABS *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  undefined4 uVar1;
  double dVar2;
  undefined4 uVar3;
  tensor *ptVar4;
  tensor *ptVar5;
  
  (this->super_node).isbuild = true;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_node).grad_fn,
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  ptVar5 = (tensor *)operator_new(0x20);
  ptVar5->data = 0.0;
  ptVar5->grad = 0.0;
  ptVar5->cnt = 0;
  ptVar5->cnt_free = 0;
  ptVar5->hook = (node *)0x0;
  tensor::tensor_cnt = tensor::tensor_cnt + 1;
  (this->super_node).ret = ptVar5;
  ptVar4 = *(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  dVar2 = ptVar4->data;
  if (dVar2 <= -dVar2) {
    dVar2 = -dVar2;
  }
  ptVar5->data = dVar2;
  *(this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = *(double *)(&DAT_001070a0 + (ulong)(0.0 < ptVar4->data) * 8);
  uVar1 = ptVar4->cnt;
  uVar3 = ptVar4->cnt_free;
  ptVar4->cnt = uVar1 + 1;
  ptVar4->cnt_free = uVar3 + 1;
  ptVar5->hook = &this->super_node;
  return ptVar5;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = input[0]->data>0 ? input[0]->data:-input[0]->data;
        grad_fn[0]=input[0]->data>0 ? 1:-1;
        input[0]->cnt++;
        input[0]->cnt_free++;
        ret->hook=this;
        return ret;
    }